

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

char * libssh2_hostkey_hash(LIBSSH2_SESSION *session,int hash_type)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  
  if (hash_type == 3) {
    puVar2 = session->server_hostkey_sha256;
    bVar3 = session->server_hostkey_sha256_valid == 0;
  }
  else if (hash_type == 2) {
    puVar2 = session->server_hostkey_sha1;
    bVar3 = session->server_hostkey_sha1_valid == 0;
  }
  else {
    if (hash_type != 1) {
      return (char *)0x0;
    }
    puVar2 = session->server_hostkey_md5;
    bVar3 = session->server_hostkey_md5_valid == 0;
  }
  puVar1 = (uchar *)0x0;
  if (!bVar3) {
    puVar1 = puVar2;
  }
  return (char *)puVar1;
}

Assistant:

LIBSSH2_API const char *
libssh2_hostkey_hash(LIBSSH2_SESSION * session, int hash_type)
{
    switch(hash_type) {
#if LIBSSH2_MD5
    case LIBSSH2_HOSTKEY_HASH_MD5:
        return (session->server_hostkey_md5_valid)
          ? (char *) session->server_hostkey_md5
          : NULL;
        break;
#endif /* LIBSSH2_MD5 */
    case LIBSSH2_HOSTKEY_HASH_SHA1:
        return (session->server_hostkey_sha1_valid)
          ? (char *) session->server_hostkey_sha1
          : NULL;
        break;
    case LIBSSH2_HOSTKEY_HASH_SHA256:
        return (session->server_hostkey_sha256_valid)
          ? (char *) session->server_hostkey_sha256
          : NULL;
        break;
    default:
        return NULL;
    }
}